

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.c
# Opt level: O2

int MeasureText(char *text,int fontSize)

{
  Font font;
  float fVar1;
  Vector2 VVar2;
  
  if (defaultFont.texture.id == 0) {
    fVar1 = 0.0;
  }
  else {
    if (fontSize < 0xb) {
      fontSize = 10;
    }
    font.texture.id = defaultFont.texture.id;
    font.charsPadding = defaultFont.charsPadding;
    font._0_8_ = defaultFont._0_8_;
    font.texture._4_8_ = defaultFont.texture._4_8_;
    font.texture._12_8_ = defaultFont.texture._12_8_;
    font.recs = defaultFont.recs;
    font.chars = defaultFont.chars;
    VVar2 = MeasureTextEx(font,text,(float)fontSize,(float)((uint)fontSize / 10));
    fVar1 = VVar2.x;
  }
  return (int)fVar1;
}

Assistant:

int MeasureText(const char *text, int fontSize)
{
    Vector2 vec = { 0.0f, 0.0f };

    // Check if default font has been loaded
    if (GetFontDefault().texture.id != 0)
    {
        int defaultFontSize = 10;   // Default Font chars height in pixel
        if (fontSize < defaultFontSize) fontSize = defaultFontSize;
        int spacing = fontSize/defaultFontSize;

        vec = MeasureTextEx(GetFontDefault(), text, (float)fontSize, (float)spacing);
    }

    return (int)vec.x;
}